

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O0

void ptls_aead__do_encrypt_v
               (ptls_aead_context_t *ctx,void *_output,ptls_iovec_t *input,size_t incnt,uint64_t seq
               ,void *aad,size_t aadlen)

{
  size_t sVar1;
  ulong local_48;
  size_t i;
  uint8_t *output;
  void *aad_local;
  uint64_t seq_local;
  size_t incnt_local;
  ptls_iovec_t *input_local;
  void *_output_local;
  ptls_aead_context_t *ctx_local;
  
  (*ctx->do_encrypt_init)(ctx,seq,aad,aadlen);
  i = (size_t)_output;
  for (local_48 = 0; local_48 < incnt; local_48 = local_48 + 1) {
    sVar1 = (*ctx->do_encrypt_update)(ctx,(void *)i,input[local_48].base,input[local_48].len);
    i = sVar1 + i;
  }
  (*ctx->do_encrypt_final)(ctx,(void *)i);
  return;
}

Assistant:

inline void ptls_aead__do_encrypt_v(ptls_aead_context_t *ctx, void *_output, ptls_iovec_t *input, size_t incnt, uint64_t seq,
                                    const void *aad, size_t aadlen)
{
    uint8_t *output = (uint8_t *)_output;

    ctx->do_encrypt_init(ctx, seq, aad, aadlen);
    for (size_t i = 0; i < incnt; ++i)
        output += ctx->do_encrypt_update(ctx, output, input[i].base, input[i].len);
    ctx->do_encrypt_final(ctx, output);
}